

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

int32_t ucurr_forLocaleAndDate_63
                  (char *locale,UDate date,int32_t index,UChar *buff,int32_t buffCapacity,
                  UErrorCode *ec)

{
  UErrorCode UVar1;
  int32_t iVar2;
  char *pcVar3;
  UResourceBundle *pUVar4;
  UResourceBundle *pUVar5;
  int32_t *piVar6;
  uint uVar7;
  UErrorCode *ec_00;
  ulong uVar8;
  UChar *src;
  int32_t resLen;
  int local_12c;
  UErrorCode localStatus;
  int32_t local_124;
  UResourceBundle *local_120;
  UChar *local_118;
  ulong local_110;
  UResourceBundle *local_108;
  uint local_fc;
  int32_t toLength;
  int32_t fromLength;
  double local_f0;
  UDate local_e8;
  UResourceBundle *local_e0;
  char id [157];
  
  if (ec == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *ec) {
    return 0;
  }
  if (buff == (UChar *)0x0 && buffCapacity != 0) {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  localStatus = U_ZERO_ERROR;
  ec_00 = (UErrorCode *)0x9d;
  local_e8 = date;
  local_124 = uloc_getKeywordValue_63(locale,"currency",id,0x9d,&localStatus);
  idForLocale(locale,id,(int)ec,ec_00);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar3 = strchr(id,0x5f);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    pUVar4 = ures_openDirect_63("icudt63l-curr","supplementalData",&localStatus);
    pUVar5 = ures_getByKey_63(pUVar4,"CurrencyMap",pUVar4,&localStatus);
    pUVar4 = ures_getByKey_63(pUVar4,id,pUVar5,&localStatus);
    local_108 = pUVar4;
    if (localStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((index < 1) || (iVar2 = ures_getSize_63(pUVar4), iVar2 < index)) {
        ures_close_63(pUVar4);
        goto LAB_002c24a6;
      }
      uVar8 = 0;
      uVar7 = 0;
      local_118 = (UChar *)0x0;
      local_12c = 0;
      do {
        iVar2 = ures_getSize_63(pUVar4);
        if (iVar2 <= (int)uVar8) {
          uVar7 = uVar7 ^ 1;
          src = local_118;
          goto LAB_002c2522;
        }
        local_110 = uVar8;
        pUVar4 = ures_getByIndex_63(pUVar4,(int)uVar8,(UResourceBundle *)0x0,&localStatus);
        local_118 = ures_getStringByKey_63(pUVar4,"id",&local_124,&localStatus);
        fromLength = 0;
        local_e0 = ures_getByKey_63(pUVar4,"from",(UResourceBundle *)0x0,&localStatus);
        piVar6 = ures_getIntVector_63(local_e0,&fromLength,&localStatus);
        local_f0 = (double)CONCAT44(*piVar6,piVar6[1]);
        iVar2 = ures_getSize_63(pUVar4);
        if (iVar2 < 3) {
          if ((local_f0 <= local_e8) &&
             (local_12c = local_12c + 1, uVar7 = uVar7 & 0xff, local_12c == index)) {
            uVar7 = 1;
          }
        }
        else {
          toLength = 0;
          local_120 = pUVar4;
          local_fc = uVar7 & 0xff;
          pUVar5 = ures_getByKey_63(pUVar4,"to",(UResourceBundle *)0x0,&localStatus);
          piVar6 = ures_getIntVector_63(pUVar5,&toLength,&localStatus);
          pUVar4 = local_120;
          if (((local_f0 <= local_e8) && (local_e8 < (double)CONCAT44(*piVar6,piVar6[1]))) &&
             (local_12c = local_12c + 1, uVar7 = local_fc, local_12c == index)) {
            uVar7 = 1;
          }
          ures_close_63(pUVar5);
        }
        uVar8 = local_110;
        ures_close_63(pUVar4);
        ures_close_63(local_e0);
        uVar8 = (ulong)((int)uVar8 + 1);
        pUVar4 = local_108;
      } while ((uVar7 & 1) == 0);
      uVar7 = 0;
      src = local_118;
    }
    else {
      uVar7 = 1;
      src = (UChar *)0x0;
    }
LAB_002c2522:
    ures_close_63(pUVar4);
    UVar1 = *ec;
    if (localStatus != U_ZERO_ERROR || *ec == U_ZERO_ERROR) {
      *ec = localStatus;
      UVar1 = localStatus;
    }
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (buffCapacity <= local_124 || (uVar7 & 1) != 0) goto LAB_002c24a6;
      u_strcpy_63(buff,src);
    }
    iVar2 = u_terminateUChars_63(buff,buffCapacity,local_124,ec);
  }
  else {
LAB_002c24a6:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2 
ucurr_forLocaleAndDate(const char* locale, 
                UDate date, 
                int32_t index,
                UChar* buff, 
                int32_t buffCapacity, 
                UErrorCode* ec)
{
    int32_t resLen = 0;
	int32_t currIndex = 0;
    const UChar* s = NULL;

    if (ec != NULL && U_SUCCESS(*ec))
    {
        // check the arguments passed
        if ((buff && buffCapacity) || !buffCapacity )
        {
            // local variables
            UErrorCode localStatus = U_ZERO_ERROR;
            char id[ULOC_FULLNAME_CAPACITY];
            resLen = uloc_getKeywordValue(locale, "currency", id, ULOC_FULLNAME_CAPACITY, &localStatus);

            // get country or country_variant in `id'
            /*uint32_t variantType =*/ idForLocale(locale, id, sizeof(id), ec);
            if (U_FAILURE(*ec))
            {
                return 0;
            }

            // Remove variants, which is only needed for registration.
            char *idDelim = strchr(id, VAR_DELIM);
            if (idDelim)
            {
                idDelim[0] = 0;
            }

            // Look up the CurrencyMap element in the root bundle.
            UResourceBundle *rb = ures_openDirect(U_ICUDATA_CURR, CURRENCY_DATA, &localStatus);
            UResourceBundle *cm = ures_getByKey(rb, CURRENCY_MAP, rb, &localStatus);

            // Using the id derived from the local, get the currency data
            UResourceBundle *countryArray = ures_getByKey(rb, id, cm, &localStatus);

            // process each currency to see which one is valid for the given date
            bool matchFound = false;
            if (U_SUCCESS(localStatus))
            {
                if ((index <= 0) || (index> ures_getSize(countryArray)))
                {
                    // requested index is out of bounds
                    ures_close(countryArray);
                    return 0;
                }

                for (int32_t i=0; i<ures_getSize(countryArray); i++)
                {
                    // get the currency resource
                    UResourceBundle *currencyRes = ures_getByIndex(countryArray, i, NULL, &localStatus);
                    s = ures_getStringByKey(currencyRes, "id", &resLen, &localStatus);

                    // get the from date
                    int32_t fromLength = 0;
                    UResourceBundle *fromRes = ures_getByKey(currencyRes, "from", NULL, &localStatus);
                    const int32_t *fromArray = ures_getIntVector(fromRes, &fromLength, &localStatus);

                    int64_t currDate64 = (int64_t)fromArray[0] << 32;
                    currDate64 |= ((int64_t)fromArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                    UDate fromDate = (UDate)currDate64;

                    if (ures_getSize(currencyRes)> 2)
                    {
                        int32_t toLength = 0;
                        UResourceBundle *toRes = ures_getByKey(currencyRes, "to", NULL, &localStatus);
                        const int32_t *toArray = ures_getIntVector(toRes, &toLength, &localStatus);

                        currDate64 = (int64_t)toArray[0] << 32;
                        currDate64 |= ((int64_t)toArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                        UDate toDate = (UDate)currDate64;

                        if ((fromDate <= date) && (date < toDate))
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }

                        ures_close(toRes);
                    }
                    else
                    {
                        if (fromDate <= date)
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }
                    }

                    // close open resources
                    ures_close(currencyRes);
                    ures_close(fromRes);

                    // check for loop exit
                    if (matchFound)
                    {
                        break;
                    }

                } // end For loop
            }

            ures_close(countryArray);

            // Check for errors
            if (*ec == U_ZERO_ERROR || localStatus != U_ZERO_ERROR)
            {
                // There is nothing to fallback to. 
                // Report the failure/warning if possible.
                *ec = localStatus;
            }

            if (U_SUCCESS(*ec))
            {
                // no errors
                if((buffCapacity> resLen) && matchFound)
                {
                    // write out the currency value
                    u_strcpy(buff, s);
                }
                else
                {
                    return 0;
                }
            }

            // return null terminated currency string
            return u_terminateUChars(buff, buffCapacity, resLen, ec);
        }
        else
        {
            // illegal argument encountered
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }

    }

    // If we got here, either error code is invalid or
    // some argument passed is no good.
    return resLen;
}